

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QString * __thiscall
QFileDialogPrivate::getEnvironmentVariable
          (QString *__return_storage_ptr__,QFileDialogPrivate *this,QString *string)

{
  char cVar1;
  long in_FS_OFFSET;
  QStringView local_50;
  QStringView local_40;
  QArrayDataPointer<char> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)(string->d).size < 2) ||
     (cVar1 = QString::startsWith((QChar)(char16_t)string,0x24), cVar1 == '\0')) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&string->d);
      return __return_storage_ptr__;
    }
  }
  else {
    local_50.m_data = (string->d).ptr;
    local_50.m_size = (string->d).size;
    local_40 = QStringView::mid(&local_50,1,-1);
    QStringView::toLatin1((QByteArray *)&local_30,&local_40);
    qEnvironmentVariable((char *)__return_storage_ptr__);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QFileDialogPrivate::getEnvironmentVariable(const QString &string)
{
#ifdef Q_OS_UNIX
    if (string.size() > 1 && string.startsWith(u'$')) {
        return qEnvironmentVariable(QStringView{string}.mid(1).toLatin1().constData());
    }
#else
    if (string.size() > 2 && string.startsWith(u'%') && string.endsWith(u'%')) {
        return qEnvironmentVariable(QStringView{string}.mid(1, string.size() - 2).toLatin1().constData());
    }
#endif
    return string;
}